

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::SplitTxOutRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::SplitTxOutRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *psVar3;
  undefined8 uVar4;
  ErrorResponse res_1;
  RawTransactionResponse res;
  SplitTxOutRequestStruct request;
  SplitTxOutRequest req;
  undefined1 local_2d0 [40];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_208;
  undefined1 local_1e8 [16];
  undefined *local_1d8 [2];
  int local_1c8;
  _Alloc_hider local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  char local_190 [16];
  undefined1 local_180 [48];
  undefined1 auStack_150 [32];
  _Base_ptr p_Stack_130;
  size_t local_128;
  SplitTxOutRequestStruct local_120;
  SplitTxOutRequest local_b0;
  
  SplitTxOutRequest::SplitTxOutRequest(&local_b0);
  core::JsonClassBase<cfd::js::api::json::SplitTxOutRequest>::Deserialize
            (&local_b0.super_JsonClassBase<cfd::js::api::json::SplitTxOutRequest>,(string *)this);
  SplitTxOutRequest::ConvertToStruct(&local_120,&local_b0);
  local_2d0._0_8_ = local_2d0 + 0x10;
  local_2d0._8_8_ = 0;
  local_2d0[0x10] = '\0';
  local_2d0._32_4_ = 0;
  local_2a8._M_p = (pointer)&local_298;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  p_Var1 = &local_268._M_impl.super__Rb_tree_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_238._M_impl.super__Rb_tree_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_120.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f7833:
      uVar4 = std::__throw_bad_function_call();
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_1e8);
      psVar3 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
      if (psVar3 != (string *)&local_2a8) {
        operator_delete(psVar3);
      }
      RawTransactionResponseStruct::~RawTransactionResponseStruct
                ((RawTransactionResponseStruct *)local_2d0);
      SplitTxOutRequestStruct::~SplitTxOutRequestStruct(&local_120);
      SplitTxOutRequest::~SplitTxOutRequest(&local_b0);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((RawTransactionResponseStruct *)local_1e8,(_Any_data *)bitcoin_function,&local_120);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f7833;
    (**(code **)((long)&request_message->field_2 + 8))(local_1e8,request_message,&local_120);
  }
  std::__cxx11::string::operator=((string *)local_2d0,(string *)local_1e8);
  local_2d0._32_4_ = local_1c8;
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_1c0);
  std::__cxx11::string::operator=((string *)&local_288,(string *)(local_1b0 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_268);
  if ((_Base_ptr)local_180._16_8_ != (_Base_ptr)0x0) {
    local_268._M_impl.super__Rb_tree_header._M_header._M_color = local_180._8_4_;
    local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_180._16_8_;
    local_268._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_180._24_8_;
    local_268._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_180._32_8_;
    *(_Rb_tree_header **)(local_180._16_8_ + 8) = p_Var1;
    local_268._M_impl.super__Rb_tree_header._M_node_count = local_180._40_8_;
    local_180._16_8_ = (_Base_ptr)0x0;
    local_180._40_8_ = 0;
    local_180._24_8_ = (_Base_ptr)(local_180 + 8);
    local_180._32_8_ = (_Base_ptr)(local_180 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_238);
  if ((_Base_ptr)auStack_150._16_8_ != (_Base_ptr)0x0) {
    local_238._M_impl.super__Rb_tree_header._M_header._M_color = auStack_150._8_4_;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_150._16_8_;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_150._24_8_;
    local_238._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_130;
    *(_Rb_tree_header **)(auStack_150._16_8_ + 8) = p_Var2;
    local_238._M_impl.super__Rb_tree_header._M_node_count = local_128;
    auStack_150._16_8_ = (_Base_ptr)0x0;
    local_128 = 0;
    auStack_150._24_8_ = (_Base_ptr)(auStack_150 + 8);
    p_Stack_130 = (_Base_ptr)(auStack_150 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_150);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_180);
  if ((char *)local_1a0._M_allocated_capacity != local_190) {
    operator_delete((void *)local_1a0._M_allocated_capacity);
  }
  if (local_1c0._M_p != local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_2d0._32_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_1e8);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_1e8,(RawTransactionResponseStruct *)local_2d0);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
              (&local_208,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)local_1e8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_1e8);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_1e8,(InnerErrorResponseStruct *)(local_2d0 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_208,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_1e8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    local_1e8._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_1b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1e8 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_238);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_120.ignore_items._M_t);
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  ~vector(&local_120.txouts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.tx._M_dataplus._M_p != &local_120.tx.field_2) {
    operator_delete(local_120.tx._M_dataplus._M_p);
  }
  SplitTxOutRequest::~SplitTxOutRequest(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}